

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O0

void __thiscall
QSequentialAnimationGroup::updateState
          (QSequentialAnimationGroup *this,State newState,State oldState)

{
  State SVar1;
  State SVar2;
  parameter_type pQVar3;
  arrow_operator_result ppQVar4;
  State in_EDX;
  State in_ESI;
  QAbstractAnimation *in_RDI;
  QSequentialAnimationGroupPrivate *d;
  DeletionPolicy in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  d_func((QSequentialAnimationGroup *)0x68ad44);
  QAbstractAnimation::updateState(in_RDI,in_ESI,in_EDX);
  pQVar3 = QObjectBindableProperty::operator_cast_to_QAbstractAnimation_
                     ((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                       *)0x68ad6c);
  if (pQVar3 != (parameter_type)0x0) {
    if (in_ESI == Stopped) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      QAbstractAnimation::stop
                ((QAbstractAnimation *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                );
    }
    else if (in_ESI == Paused) {
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                    *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      SVar1 = QAbstractAnimation::state
                        ((QAbstractAnimation *)
                         CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      if ((in_EDX == SVar1) && (in_EDX == Running)) {
        ppQVar4 = QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                  ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                                *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        QAbstractAnimation::pause((QAbstractAnimation *)*ppQVar4);
      }
      else {
        QSequentialAnimationGroupPrivate::restart
                  ((QSequentialAnimationGroupPrivate *)
                   CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
    }
    else if (in_ESI == Running) {
      SVar1 = in_EDX;
      QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
      ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                    *)CONCAT44(in_EDX,in_stack_ffffffffffffffd0));
      SVar2 = QAbstractAnimation::state
                        ((QAbstractAnimation *)CONCAT44(SVar1,in_stack_ffffffffffffffd0));
      if ((SVar1 == SVar2) && (in_EDX == Paused)) {
        QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
        ::operator->((QObjectBindableProperty<QSequentialAnimationGroupPrivate,_QAbstractAnimation_*,_&QSequentialAnimationGroupPrivate::_qt_property_currentAnimation_offset,_nullptr>
                      *)CONCAT44(SVar1,in_stack_ffffffffffffffd0));
        QAbstractAnimation::start
                  ((QAbstractAnimation *)CONCAT44(SVar1,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      }
      else {
        QSequentialAnimationGroupPrivate::restart
                  ((QSequentialAnimationGroupPrivate *)CONCAT44(SVar1,in_stack_ffffffffffffffd0));
      }
    }
  }
  return;
}

Assistant:

void QSequentialAnimationGroup::updateState(QAbstractAnimation::State newState,
                                            QAbstractAnimation::State oldState)
{
    Q_D(QSequentialAnimationGroup);
    QAnimationGroup::updateState(newState, oldState);

    if (!d->currentAnimation)
        return;

    switch (newState) {
    case Stopped:
        d->currentAnimation->stop();
        break;
    case Paused:
        if (oldState == d->currentAnimation->state()
            && oldState == QSequentialAnimationGroup::Running) {
                d->currentAnimation->pause();
            }
        else
            d->restart();
        break;
    case Running:
        if (oldState == d->currentAnimation->state()
            && oldState == QSequentialAnimationGroup::Paused)
            d->currentAnimation->start();
        else
            d->restart();
        break;
    }
}